

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

natwm_error string_find_last_nonspace(char *string,size_t *index_result)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  natwm_error nVar4;
  ushort **ppuVar5;
  size_t sVar6;
  size_t sVar7;
  
  if (string == (char *)0x0) {
    nVar4 = INVALID_INPUT_ERROR;
  }
  else {
    sVar6 = 0;
    bVar2 = false;
    for (sVar7 = 0; cVar1 = string[sVar7], (long)cVar1 != 0; sVar7 = sVar7 + 1) {
      ppuVar5 = __ctype_b_loc();
      bVar3 = bVar2;
      if (!bVar2) {
        bVar3 = true;
      }
      if ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        sVar6 = sVar7;
        bVar2 = bVar3;
      }
    }
    *index_result = sVar6;
    nVar4 = NOT_FOUND_ERROR;
    if (bVar2) {
      nVar4 = NO_ERROR;
    }
  }
  return nVar4;
}

Assistant:

enum natwm_error string_find_last_nonspace(const char *string, size_t *index_result)
{
        if (string == NULL) {
                return INVALID_INPUT_ERROR;
        }

        char ch = '\0';
        size_t i = 0;
        size_t index = 0;
        bool found = false;

        while ((ch = string[i]) != '\0') {
                if (!isspace(ch)) {
                        index = i;

                        if (!found) {
                                found = true;
                        }
                }

                ++i;
        }

        *index_result = index;

        if (!found) {
                return NOT_FOUND_ERROR;
        }

        return NO_ERROR;
}